

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_data.cc
# Opt level: O2

void __thiscall
re2c::Skeleton::generate_paths_cunit_key<unsigned_char,unsigned_int>
          (Skeleton *this,FILE *input,FILE *keys)

{
  uint32_t line;
  Node *this_00;
  covers_t size;
  path_t prefix;
  covers_t local_6c;
  string local_68;
  path_t local_48;
  
  this_00 = this->nodes;
  local_48.rule = this_00->rule;
  local_48.ctx = this_00->ctx;
  local_48.arcs.
  super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.arcs.
  super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.arcs.
  super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.rule_pos = 0;
  local_48.ctx_pos = 0;
  local_6c.value = 0;
  Node::cover<unsigned_char,unsigned_int>(this_00,&local_48,input,keys,&local_6c);
  if (local_6c.value == 0x40000000) {
    line = this->line;
    incond(&local_68,&this->cond);
    warning((char *)0x0,line,false,"DFA %sis too large: can only generate partial path cover",
            local_68._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::
  _Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ::~_Vector_base((_Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                   *)&local_48);
  return;
}

Assistant:

void Skeleton::generate_paths_cunit_key (FILE * input, FILE * keys)
{
	path_t prefix (nodes->rule, nodes->ctx);
	Node::covers_t size = Node::covers_t::from32(0u);

	nodes->cover<cunit_t, key_t> (prefix, input, keys, size);

	if (size.overflow ())
	{
		warning
			( NULL
			, line
			, false
			, "DFA %sis too large: can only generate partial path cover"
			, incond (cond).c_str ()
			);
	}
}